

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void MutableS2ShapeIndex::ClipVAxis
               (ClippedEdge *edge,R1Interval *middle,
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               *child_edges,EdgeAllocator *alloc)

{
  double v;
  ClippedEdge *edge_local;
  ClippedEdge *local_28;
  
  edge_local = edge;
  if ((middle->bounds_).c_[0] < (edge->bound).bounds_[1].bounds_.c_[1]) {
    v = (middle->bounds_).c_[1];
    if ((edge->bound).bounds_[1].bounds_.c_[0] < v) {
      local_28 = ClipVBound(edge,1,v,alloc);
      std::
      vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
      ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                  *)child_edges,&local_28);
      local_28 = ClipVBound(edge_local,0,(middle->bounds_).c_[0],alloc);
      std::
      vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
      ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                  *)(child_edges + 1),&local_28);
      return;
    }
    child_edges = child_edges + 1;
  }
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::push_back(child_edges,&edge_local);
  return;
}

Assistant:

inline void MutableS2ShapeIndex::ClipVAxis(
    const ClippedEdge* edge,
    const R1Interval& middle,
    vector<const ClippedEdge*> child_edges[2],
    EdgeAllocator* alloc) {
  if (edge->bound[1].hi() <= middle.lo()) {
    // Edge is entirely contained in the lower child.
    child_edges[0].push_back(edge);
  } else if (edge->bound[1].lo() >= middle.hi()) {
    // Edge is entirely contained in the upper child.
    child_edges[1].push_back(edge);
  } else {
    // The edge bound spans both children.
    child_edges[0].push_back(ClipVBound(edge, 1, middle.hi(), alloc));
    child_edges[1].push_back(ClipVBound(edge, 0, middle.lo(), alloc));
  }
}